

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPat.c
# Opt level: O3

void Gia_SatCollectCone_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vVisit)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = *(ulong *)pObj;
  uVar5 = (uint)(uVar3 >> 0x3d) & 2;
  uVar6 = (uint)(uVar3 >> 0x1e) & 1;
  if (uVar5 + uVar6 != 3) {
    if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
      Gia_SatCollectCone_rec(p,pObj + -(uVar3 & 0x1fffffff),vVisit);
      Gia_SatCollectCone_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vVisit);
      uVar3 = *(ulong *)pObj;
      uVar5 = (uint)(uVar3 >> 0x3d) & 2;
      uVar6 = (uint)(uVar3 >> 0x1e) & 1;
    }
    if (uVar6 != 0 || uVar5 != 0) {
      __assert_fail("Sat_ObjXValue(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                    ,0x39,"void Gia_SatCollectCone_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    *(ulong *)pObj = uVar3 | 0x4000000040000000;
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar5 = vVisit->nSize;
    if (uVar5 == vVisit->nCap) {
      if ((int)uVar5 < 0x10) {
        if (vVisit->pArray == (int *)0x0) {
          piVar4 = (int *)malloc(0x40);
        }
        else {
          piVar4 = (int *)realloc(vVisit->pArray,0x40);
        }
        vVisit->pArray = piVar4;
        if (piVar4 == (int *)0x0) {
LAB_00707b9d:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vVisit->nCap = 0x10;
      }
      else {
        if (vVisit->pArray == (int *)0x0) {
          piVar4 = (int *)malloc((ulong)uVar5 * 8);
        }
        else {
          piVar4 = (int *)realloc(vVisit->pArray,(ulong)uVar5 * 8);
        }
        vVisit->pArray = piVar4;
        if (piVar4 == (int *)0x0) goto LAB_00707b9d;
        vVisit->nCap = uVar5 * 2;
      }
    }
    else {
      piVar4 = vVisit->pArray;
    }
    iVar1 = vVisit->nSize;
    vVisit->nSize = iVar1 + 1;
    piVar4[iVar1] = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555;
  }
  return;
}

Assistant:

void Gia_SatCollectCone_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vVisit )
{
    if ( Sat_ObjXValue(pObj) == GIA_UND )
        return;
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_SatCollectCone_rec( p, Gia_ObjFanin0(pObj), vVisit );
        Gia_SatCollectCone_rec( p, Gia_ObjFanin1(pObj), vVisit );
    }
    assert( Sat_ObjXValue(pObj) == 0 );
    Sat_ObjSetXValue( pObj, GIA_UND );
    Vec_IntPush( vVisit, Gia_ObjId(p, pObj) );
}